

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanorod_pentBuilderCmd.cpp
# Opt level: O2

void free_multiple_field(uint len,void *arg,char ***orig)

{
  long lVar1;
  
  if (arg != (void *)0x0) {
    for (lVar1 = 0; (ulong)len << 3 != lVar1; lVar1 = lVar1 + 8) {
      free_string_field((char **)((long)*orig + lVar1));
    }
    free(arg);
    free(*orig);
    *orig = (char **)0x0;
  }
  return;
}

Assistant:

static void
free_multiple_field(unsigned int len, void *arg, char ***orig)
{
  unsigned int i;
  if (arg) {
    for (i = 0; i < len; ++i)
      {
        free_string_field(&((*orig)[i]));
      }

    free (arg);
    free (*orig);
    *orig = 0;
  }
}